

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O0

int runstattests(double *x,int N,char *test,char *mtype,double alpha)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  int local_12c;
  int local_128;
  int ltstat;
  int cvcols;
  int cvrows;
  int pN;
  int laux;
  double teststat [3];
  double local_f8;
  double auxstat [2];
  double cprobs [3];
  double local_c8;
  double cval [9];
  double pval;
  double stat;
  char *selectlags;
  char *model;
  char *type;
  char *alternative;
  int local_48;
  int lshort;
  int klag;
  int diff;
  double alpha_local;
  char *mtype_local;
  char *test_local;
  double *pdStack_20;
  int N_local;
  double *x_local;
  
  _klag = alpha;
  alpha_local = (double)mtype;
  mtype_local = test;
  test_local._4_4_ = N;
  pdStack_20 = x;
  memset(&local_c8,0,0x48);
  memset(auxstat + 1,0,0x18);
  memset(&local_f8,0,0x10);
  memset(&pN,0,0x18);
  iVar2 = strcmp(mtype_local,"kpss");
  if (iVar2 == 0) {
    iVar2 = strcmp((char *)alpha_local,"level");
    if (iVar2 == 0) {
      model = "level";
    }
    else {
      iVar2 = strcmp((char *)alpha_local,"trend");
      if (iVar2 != 0) {
        printf("ndiffs only accepts one of two types : level and trend. \n");
        exit(-1);
      }
      model = "trend";
    }
    dVar3 = sqrt((double)test_local._4_4_);
    local_48 = (int)((dVar3 * 3.0) / 13.0);
    alternative._4_4_ = 1;
    ur_kpss(pdStack_20,test_local._4_4_,model,1,&local_48,&pval,cval + 8);
    bVar1 = cval[8] < _klag;
  }
  else {
    iVar2 = strcmp(mtype_local,"df");
    if ((iVar2 == 0) || (iVar2 = strcmp(mtype_local,"adf"), iVar2 == 0)) {
      iVar2 = strcmp((char *)alpha_local,"level");
      if (iVar2 == 0) {
        model = "drift";
      }
      else {
        iVar2 = strcmp((char *)alpha_local,"trend");
        if (iVar2 != 0) {
          printf("ndiffs only accepts one of two types : level and trend. \n");
          exit(-1);
        }
        model = "trend";
      }
      stat = (double)anon_var_dwarf_107c9;
      local_48 = 1;
      cvcols = 3;
      ur_df2(pdStack_20,test_local._4_4_,model,&local_48,"fixed",&local_c8,&ltstat,&local_128,
             auxstat + 1,(double *)&pN,&local_12c);
      pval = _pN;
      dVar3 = interpolate_linear(&local_c8,auxstat + 1,cvcols,_pN);
      bVar1 = _klag < dVar3;
    }
    else {
      iVar2 = strcmp(mtype_local,"pp");
      if (iVar2 != 0) {
        printf("Only three tests are allowed - kpss, df and pp \n");
        exit(-1);
      }
      iVar2 = strcmp((char *)alpha_local,"level");
      if (iVar2 == 0) {
        selectlags = "constant";
      }
      else {
        iVar2 = strcmp((char *)alpha_local,"trend");
        if (iVar2 != 0) {
          printf("ndiffs KPSS only accepts one of two types : level and trend. \n");
          exit(-1);
        }
        selectlags = "trend";
      }
      model = "Z-tau";
      alternative._4_4_ = 1;
      cvcols = 3;
      ur_pp2(pdStack_20,test_local._4_4_,"Z-tau",selectlags,1,(int *)0x0,&local_c8,auxstat + 1,
             &local_f8,&cvrows,&pval);
      dVar3 = interpolate_linear(&local_c8,auxstat + 1,cvcols,pval);
      bVar1 = _klag < dVar3;
    }
  }
  lshort = (int)bVar1;
  return lshort;
}

Assistant:

static int runstattests(double *x, int N, const char * test,const char *mtype,double alpha) {
    int diff,klag,lshort;
    const char *alternative;
    const char *type;
    const char *model;
    const char *selectlags;
    double stat, pval;
    double cval[9] = {0,0,0,0,0,0,0,0,0};
	double cprobs[3] = {0,0,0};
	double auxstat[2] = {0,0};
    double teststat[3] = {0,0,0};
	int laux,pN,cvrows,cvcols,ltstat;

    if (!strcmp(test,"kpss")) {
        if (!strcmp(mtype,"level")) {
            type = "level";
        } else if (!strcmp(mtype,"trend")) {
            type = "trend";
        } else {
            printf("ndiffs only accepts one of two types : level and trend. \n");
            exit(-1);
        }
        
        klag = (int) 3.0 * sqrt((double)N) / 13.0;
        lshort = 1;
        ur_kpss(x,N,type,lshort,&klag,&stat,&pval);
        //printf("KPSS stat %g pval %g \n",stat,pval);
        diff = (pval < alpha) ? 1 : 0;
    } else if (!strcmp(test,"df") || !strcmp(test,"adf")) {
        if (!strcmp(mtype,"level")) {
            type = "drift";
        } else if (!strcmp(mtype,"trend")) {
            type = "trend";
        } else {
            printf("ndiffs only accepts one of two types : level and trend. \n");
            exit(-1);
        }
        selectlags = "fixed";
        klag = 1;
        pN = 3;
        //alternative = "stationary";
        //ur_df(x,N,alternative,NULL,&stat,&pval);
        ur_df2(x,N,type,&klag,selectlags,cval,&cvrows,&cvcols, cprobs, teststat,&ltstat);
        stat = teststat[0];
        pval = interpolate_linear(cval,cprobs,pN,stat);
        //printf("ADF stat %g pval %g \n",stat,pval);
        diff = (pval > alpha) ? 1 : 0;
    } else if (!strcmp(test,"pp")) {
        if (!strcmp(mtype,"level")) {
            model = "constant";
        } else if (!strcmp(mtype,"trend")) {
            model = "trend";
        } else {
            printf("ndiffs KPSS only accepts one of two types : level and trend. \n");
            exit(-1);
        }
        type = "Z-tau";
        lshort = 1;
        pN = 3;
        //ur_pp(x,N,alternative,type,lshort,NULL, &stat,&pval);
        ur_pp2(x,N,type,model,lshort,NULL,cval,cprobs,auxstat,&laux,&stat);
        pval = interpolate_linear(cval,cprobs,pN,stat);
        //printf("PP stat %g pval %g \n",stat,pval);
        diff = (pval > alpha) ? 1 : 0;
    } else {
        printf("Only three tests are allowed - kpss, df and pp \n");
        exit(-1);
    }

    return diff;
}